

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

PacketBuilder * __thiscall
PacketBuilder::AddBreakString(PacketBuilder *this,string *str,uchar breakchar)

{
  undefined1 *puVar1;
  long local_48;
  size_t breakin;
  string tempstr;
  uchar breakchar_local;
  string *str_local;
  PacketBuilder *this_local;
  
  tempstr.field_2._M_local_buf[0xf] = breakchar;
  std::__cxx11::string::string((string *)&breakin,(string *)str);
  local_48 = std::__cxx11::string::find_first_of
                       ((char)&breakin,(ulong)(uint)(int)tempstr.field_2._M_local_buf[0xf]);
  while (local_48 != -1) {
    puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&breakin);
    *puVar1 = 0x79;
    local_48 = std::__cxx11::string::find_first_of
                         ((char)&breakin,(ulong)(uint)(int)tempstr.field_2._M_local_buf[0xf]);
  }
  std::__cxx11::string::operator+=((string *)&this->data,(string *)&breakin);
  std::__cxx11::string::operator+=((string *)&this->data,tempstr.field_2._M_local_buf[0xf]);
  std::__cxx11::string::~string((string *)&breakin);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddBreakString(const std::string &str, unsigned char breakchar)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	std::string tempstr(str);
	std::size_t breakin = tempstr.find_first_of(breakchar);

	while (breakin != std::string::npos)
	{
		tempstr[breakin] = 'y';
		breakin = tempstr.find_first_of(breakchar, breakin+1);
	}

	this->data += tempstr;
	this->data += breakchar;


#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}